

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall
cmTargetCollectLinkLanguages::~cmTargetCollectLinkLanguages(cmTargetCollectLinkLanguages *this)

{
  std::
  _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  ::~_Rb_tree(&(this->Visited)._M_t);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

cmTargetCollectLinkLanguages(cmGeneratorTarget const* target,
                               const std::string& config,
                               CM_UNORDERED_SET<std::string>& languages,
                               cmGeneratorTarget const* head)
    : Config(config)
    , Languages(languages)
    , HeadTarget(head)
    , Target(target)
  {
    this->Visited.insert(target);
  }